

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnter(SPxDevexPR<double> *this)

{
  SPxSolverBase<double> *pSVar1;
  SPxOut *pSVar2;
  bool bVar3;
  int iVar4;
  DataKey DVar5;
  Verbosity old_verbosity;
  DataKey local_30;
  SPxColId local_24;
  undefined4 local_1c;
  
  DVar5 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance);
  local_30 = DVar5;
  if (DVar5.info < 1) {
LAB_001fdc23:
    iVar4 = DVar5.info;
    if (-1 < DVar5.info) goto LAB_001fdc57;
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxRowId::SPxRowId((SPxRowId *)&local_24,(SPxId *)&local_30);
    bVar3 = SPxSolverBase<double>::isBasic(pSVar1,(SPxRowId *)&local_24);
    if (!bVar3) {
      iVar4 = local_30.info;
      goto LAB_001fdc57;
    }
    local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
  }
  else {
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxColId::SPxColId(&local_24,(SPxId *)&local_30);
    bVar3 = SPxSolverBase<double>::isBasic(pSVar1,&local_24);
    if (!bVar3) {
      DVar5 = (DataKey)((ulong)local_30 & 0xffffffff);
      goto LAB_001fdc23;
    }
    local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
    iVar4 = 0;
LAB_001fdc57:
    if (iVar4 != 0) {
      return (SPxId)local_30;
    }
  }
  if (this->refined != false) {
    return (SPxId)local_30;
  }
  this->refined = true;
  pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_1c = 5;
    local_24.super_DataKey.info = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                       "WDEVEX02 trying refinement step..\n");
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_24);
  }
  DVar5 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance * 0.5);
  local_30 = DVar5;
  if (0 < DVar5.info) {
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxColId::SPxColId(&local_24,(SPxId *)&local_30);
    bVar3 = SPxSolverBase<double>::isBasic(pSVar1,&local_24);
    if (bVar3) goto LAB_001fdd3f;
    DVar5 = (DataKey)((ulong)local_30 & 0xffffffff);
  }
  if (-1 < DVar5.info) {
    return (SPxId)local_30;
  }
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  SPxRowId::SPxRowId((SPxRowId *)&local_24,(SPxId *)&local_30);
  bVar3 = SPxSolverBase<double>::isBasic(pSVar1,(SPxRowId *)&local_24);
  if (!bVar3) {
    return (SPxId)local_30;
  }
LAB_001fdd3f:
  local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
  return (SPxId)local_30;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}